

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepTiledInputFile::Data::readTiles
          (Data *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly,bool countsOnly)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> aVar5;
  int iVar6;
  void *pvVar7;
  Task *this_00;
  __base_type _Var8;
  ostream *poVar9;
  InputExc *pIVar10;
  IoExc *this_01;
  undefined4 in_register_0000000c;
  int iVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  undefined8 *puVar15;
  ulong uVar16;
  long lVar17;
  TileProcess *this_02;
  __base_type _Var18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  TaskGroup tg;
  exr_chunk_info_t cinfo;
  TileProcessGroup tpg;
  stringstream _iex_throw_s;
  ulong local_478;
  TaskGroup local_450 [8];
  ulong local_448;
  exr_chunk_info_t local_440;
  undefined1 local_400 [40];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_3b8;
  undefined1 local_278 [16];
  undefined8 auStack_268 [2];
  uint64_t uStack_258;
  uint64_t local_250;
  uint64_t uStack_248;
  uint64_t local_240;
  uint64_t uStack_238;
  
  local_478 = CONCAT44(in_register_0000000c,dy1);
  if (1 < ((dy2 - dy1) + 1) * ((dx2 - dx1) + 1)) {
    uVar1 = this->numThreads;
    lVar17 = (long)(int)uVar1;
    if (1 < lVar17) {
      IlmThread_3_4::Semaphore::Semaphore((Semaphore *)local_400,uVar1);
      local_3c8 = (undefined1  [16])0x0;
      local_3d8 = (undefined1  [16])0x0;
      local_3b8._M_b._M_p = (__base_type)(__pointer_type)0x0;
      uVar13 = lVar17 * 0x248;
      pvVar7 = operator_new(uVar13);
      lVar12 = 0;
      do {
        memset((void *)(lVar12 + (long)pvVar7),0,0x248);
        *(undefined4 *)((long)pvVar7 + lVar12) = 0x21;
        *(undefined1 *)((long)pvVar7 + lVar12 + 4) = 1;
        lVar12 = lVar12 + 0x248;
      } while (uVar13 - lVar12 != 0);
      uVar4 = local_3d8._8_8_;
      pvVar14 = pvVar7;
      this_02 = (TileProcess *)local_3d8._0_8_;
      if (local_3d8._0_8_ != local_3d8._8_8_) {
        do {
          local_448 = uVar13;
          memcpy(pvVar14,this_02,0x248);
          anon_unknown_14::TileProcess::~TileProcess(this_02);
          this_02 = this_02 + 1;
          pvVar14 = (void *)((long)pvVar14 + 0x248);
          uVar13 = local_448;
        } while (this_02 != (TileProcess *)uVar4);
      }
      if ((TileProcess *)local_3d8._0_8_ != (TileProcess *)0x0) {
        operator_delete((void *)local_3d8._0_8_,local_3c8._0_8_ - local_3d8._0_8_);
      }
      auVar3 = _DAT_001b2460;
      local_3d8._8_8_ = uVar13 + (long)pvVar7;
      local_3d8._0_8_ = pvVar7;
      lVar17 = lVar17 + -1;
      auVar20._8_4_ = (int)lVar17;
      auVar20._0_8_ = lVar17;
      auVar20._12_4_ = (int)((ulong)lVar17 >> 0x20);
      puVar15 = (undefined8 *)((long)pvVar7 + 0x488);
      uVar16 = 0;
      auVar20 = auVar20 ^ _DAT_001b2460;
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar21 = _DAT_001b3230;
      do {
        auVar23 = auVar21 ^ auVar3;
        lVar17 = auVar21._8_8_;
        if ((bool)(~(auVar23._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar23._0_4_ ||
                    auVar20._4_4_ < auVar23._4_4_) & 1)) {
          pvVar14 = (void *)0x0;
          if (uVar1 - 1 != uVar16) {
            pvVar14 = (void *)((auVar21._0_8_ + 1) * 0x248 + (long)pvVar7);
          }
          puVar15[-0x49] = pvVar14;
        }
        if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
            auVar23._12_4_ <= auVar20._12_4_) {
          pvVar14 = (void *)0x0;
          if ((ulong)(uVar1 - 1) - 1 != uVar16) {
            pvVar14 = (void *)((lVar17 - auVar22._8_8_) * 0x248 + (long)pvVar7);
          }
          *puVar15 = pvVar14;
        }
        uVar16 = uVar16 + 2;
        auVar21._0_8_ = auVar21._0_8_ + 2;
        auVar21._8_8_ = lVar17 + 2;
        puVar15 = puVar15 + 0x92;
      } while ((uVar1 + 1 & 0xfffffffe) != uVar16);
      LOCK();
      local_3c8._8_8_ = pvVar7;
      local_3c8._0_8_ = uVar13 + (long)pvVar7;
      UNLOCK();
      IlmThread_3_4::TaskGroup::TaskGroup(local_450);
      if (dy1 <= dy2) {
        do {
          iVar2 = (int)local_478;
          iVar11 = dx1;
          if (dx1 <= dx2) {
            do {
              iVar6 = exr_read_tile_chunk_info
                                (*(this->_ctxt->_ctxt).
                                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,this->partNumber,iVar11,local_478,lx,ly,&local_440);
              if (iVar6 != 0) {
                if (iVar6 == 0x18) {
                  iex_debugTrap();
                  std::__cxx11::stringstream::stringstream((stringstream *)local_278);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)auStack_268,"Tile (",6);
                  poVar9 = (ostream *)std::ostream::operator<<((ostream *)auStack_268,iVar11);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,lx);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,ly);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,") is missing.",0xd);
                  pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::InputExc::InputExc(pIVar10,(stringstream *)local_278);
                  __cxa_throw(pIVar10,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
                }
                pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::InputExc::InputExc(pIVar10,"Unable to query tile information");
                __cxa_throw(pIVar10,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
              }
              this_00 = (Task *)operator_new(0x30);
              IlmThread_3_4::Task::Task(this_00,local_450);
              *(undefined ***)this_00 = &PTR__TileBufferTask_001e3260;
              *(DeepFrameBuffer **)(this_00 + 0x10) = &this->frameBuffer;
              *(Data **)(this_00 + 0x18) = this;
              IlmThread_3_4::Semaphore::wait();
              _Var8._M_p = (__pointer_type)local_3c8._8_8_;
              do {
                _Var18._M_p = _Var8._M_p;
                if (_Var18._M_p == (__pointer_type)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"GACK: serious failure case???",0x1d);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
                  std::ostream::put('\x10');
                  std::ostream::flush();
                }
                LOCK();
                bVar19 = _Var18._M_p == (__pointer_type)local_3c8._8_8_;
                _Var8._M_p = (__pointer_type)local_3c8._8_8_;
                if (bVar19) {
                  local_3c8._8_8_ = (_Var18._M_p)->next;
                  _Var8._M_p = _Var18._M_p;
                }
                UNLOCK();
              } while (!bVar19);
              *(__pointer_type *)(this_00 + 0x20) = _Var18._M_p;
              *(undefined1 **)(this_00 + 0x28) = local_400;
              ((_Var18._M_p)->cinfo).sample_count_data_offset = local_440.sample_count_data_offset;
              ((_Var18._M_p)->cinfo).sample_count_table_size = local_440.sample_count_table_size;
              ((_Var18._M_p)->cinfo).packed_size = local_440.packed_size;
              ((_Var18._M_p)->cinfo).unpacked_size = local_440.unpacked_size;
              ((_Var18._M_p)->cinfo).width = local_440.width;
              ((_Var18._M_p)->cinfo).level_x = local_440.level_x;
              ((_Var18._M_p)->cinfo).level_y = local_440.level_y;
              ((_Var18._M_p)->cinfo).type = local_440.type;
              ((_Var18._M_p)->cinfo).compression = local_440.compression;
              ((_Var18._M_p)->cinfo).data_offset = local_440.data_offset;
              ((_Var18._M_p)->cinfo).idx = local_440.idx;
              ((_Var18._M_p)->cinfo).start_x = local_440.start_x;
              ((_Var18._M_p)->cinfo).start_y = local_440.start_y;
              ((_Var18._M_p)->cinfo).height = local_440.height;
              (_Var18._M_p)->counts_only = countsOnly;
              IlmThread_3_4::ThreadPool::addGlobalTask(this_00);
              bVar19 = iVar11 != dx2;
              iVar11 = iVar11 + 1;
            } while (bVar19);
          }
          local_478 = (ulong)(iVar2 + 1);
        } while (iVar2 != dy2);
      }
      IlmThread_3_4::TaskGroup::~TaskGroup(local_450);
      aVar5._M_b._M_p = local_3b8._M_b._M_p;
      LOCK();
      local_3b8._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      if (aVar5._M_b._M_p == (__pointer_type)0x0) {
        IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::
        ~ProcessGroup((ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *)local_400);
        return;
      }
      local_278._0_8_ = auStack_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_278,*(long *)aVar5._M_b._M_p,
                 *(size_type *)((long)aVar5._M_b._M_p + 8) + *(long *)aVar5._M_b._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(long **)aVar5._M_b._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)aVar5._M_b._M_p + 0x10)) {
        operator_delete(*(long **)aVar5._M_b._M_p,
                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)aVar5._M_b._M_p + 0x10))->_M_allocated_capacity + 1);
      }
      operator_delete((void *)aVar5._M_b._M_p,0x20);
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_01,(string *)local_278);
      __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  local_278[5] = countsOnly;
  local_278._0_5_ = 0x100000021;
  if (dy1 <= dy2) {
    do {
      iVar2 = (int)local_478;
      iVar11 = dx1;
      if (dx1 <= dx2) {
        do {
          iVar6 = exr_read_tile_chunk_info
                            (*(this->_ctxt->_ctxt).
                              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,this->partNumber,iVar11,local_478,lx,ly,&local_440);
          if (iVar6 != 0) {
            if (iVar6 == 0x18) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)local_400);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_400 + 0x10),"Tile (",6);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)(local_400 + 0x10),iVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,lx);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,ly);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,") is missing.",0xd);
              pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::InputExc::InputExc(pIVar10,(stringstream *)local_400);
              __cxa_throw(pIVar10,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
            }
            pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc(pIVar10,"Unable to query tile information");
            __cxa_throw(pIVar10,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
          }
          local_240 = local_440.sample_count_data_offset;
          uStack_238 = local_440.sample_count_table_size;
          local_250 = local_440.packed_size;
          uStack_248 = local_440.unpacked_size;
          auStack_268[1]._0_4_ = local_440.width;
          auStack_268[1]._4_1_ = local_440.level_x;
          auStack_268[1]._5_1_ = local_440.level_y;
          auStack_268[1]._6_1_ = local_440.type;
          auStack_268[1]._7_1_ = local_440.compression;
          uStack_258 = local_440.data_offset;
          local_278._8_4_ = local_440.idx;
          local_278._12_4_ = local_440.start_x;
          auStack_268[0]._0_4_ = local_440.start_y;
          auStack_268[0]._4_4_ = local_440.height;
          anon_unknown_14::TileProcess::run_decode
                    ((TileProcess *)local_278,
                     *(this->_ctxt->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     this->partNumber,&this->frameBuffer,&this->fill_list);
          iVar11 = iVar11 + 1;
        } while (dx2 + 1 != iVar11);
      }
      local_478 = (ulong)(iVar2 + 1);
    } while (iVar2 != dy2);
  }
  anon_unknown_14::TileProcess::~TileProcess((TileProcess *)local_278);
  return;
}

Assistant:

void DeepTiledInputFile::Data::readTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly, bool countsOnly)
{
    int nTiles = dx2 - dx1 + 1;
    nTiles *= dy2 - dy1 + 1;

    exr_chunk_info_t      cinfo;
#if ILMTHREAD_THREADING_ENABLED
    if (nTiles > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        TileProcessGroup tpg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int ty = dy1; ty <= dy2; ++ty)
            {
                for (int tx = dx1; tx <= dx2; ++tx)
                {
                    exr_result_t rv = exr_read_tile_chunk_info (
                        *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                    if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                    {
                        THROW (
                            IEX_NAMESPACE::InputExc,
                            "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                            << ") is missing.");
                    }
                    else if (EXR_ERR_SUCCESS != rv)
                        throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                    ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                        new TileBufferTask (&tg, this, &tpg, &frameBuffer, cinfo, countsOnly) );
                }
            }
        }

        tpg.throw_on_failure ();
    }
    else
#endif
    {
        TileProcess tp;

        tp.counts_only = countsOnly;
        for (int ty = dy1; ty <= dy2; ++ty)
        {
            for (int tx = dx1; tx <= dx2; ++tx)
            {
                exr_result_t rv = exr_read_tile_chunk_info (
                    *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                        << ") is missing.");
                }
                else if (EXR_ERR_SUCCESS != rv)
                    throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                tp.cinfo = cinfo;
                tp.run_decode (
                    *_ctxt,
                    partNumber,
                    &frameBuffer,
                    fill_list);
            }
        }
    }
}